

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::simplify(Solver *this)

{
  VMap<char> *this_00;
  vec<Minisat::Lit,_int> *this_01;
  CRef CVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int i;
  long lVar6;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x283,"bool Minisat::Solver::simplify()");
  }
  if ((this->ok != true) || (CVar1 = propagate(this), CVar1 != 0xffffffff)) {
    this->ok = false;
    return false;
  }
  if ((this->trail).sz == this->simpDB_assigns) {
    return true;
  }
  if (0 < this->simpDB_props) {
    return true;
  }
  removeSatisfied(this,&this->learnts);
  if (this->remove_satisfied == true) {
    removeSatisfied(this,&this->clauses);
    this_00 = &this->seen;
    for (lVar6 = 0; lVar6 < (this->released_vars).sz; lVar6 = lVar6 + 1) {
      pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          (this->released_vars).data[lVar6]);
      if (*pcVar2 != '\0') {
        __assert_fail("seen[released_vars[i]] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                      ,0x294,"bool Minisat::Solver::simplify()");
      }
      pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          (this->released_vars).data[lVar6]);
      *pcVar2 = '\x01';
    }
    this_01 = &this->trail;
    iVar5 = 0;
    for (lVar6 = 0; lVar6 < (this->trail).sz; lVar6 = lVar6 + 1) {
      pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          this_01->data[lVar6].x >> 1);
      if (*pcVar2 == '\0') {
        lVar4 = (long)iVar5;
        iVar5 = iVar5 + 1;
        this_01->data[lVar4].x = this_01->data[lVar6].x;
      }
    }
    vec<Minisat::Lit,_int>::shrink(this_01,(int)lVar6 - iVar5);
    this->qhead = (this->trail).sz;
    for (lVar6 = 0; uVar3 = (ulong)(this->released_vars).sz, lVar6 < (long)uVar3; lVar6 = lVar6 + 1)
    {
      pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&this_00->super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                          (this->released_vars).data[lVar6]);
      *pcVar2 = '\0';
    }
    for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
      vec<int,_int>::push(&this->free_vars);
      (this->free_vars).data[(long)(this->free_vars).sz + -1] = (this->released_vars).data[lVar6];
      uVar3 = (ulong)(uint)(this->released_vars).sz;
    }
    if ((this->released_vars).data != (int *)0x0) {
      (this->released_vars).sz = 0;
    }
  }
  checkGarbage(this);
  rebuildOrderHeap(this);
  this->simpDB_assigns = (this->trail).sz;
  this->simpDB_props = this->learnts_literals + this->clauses_literals;
  return true;
}

Assistant:

bool Solver::simplify()
{
    assert(decisionLevel() == 0);

    if (!ok || propagate() != CRef_Undef)
        return ok = false;

    if (nAssigns() == simpDB_assigns || (simpDB_props > 0))
        return true;

    // Remove satisfied clauses:
    removeSatisfied(learnts);
    if (remove_satisfied){       // Can be turned off.
        removeSatisfied(clauses);

        // TODO: what todo in if 'remove_satisfied' is false?

        // Remove all released variables from the trail:
        for (int i = 0; i < released_vars.size(); i++){
            assert(seen[released_vars[i]] == 0);
            seen[released_vars[i]] = 1;
        }

        int i, j;
        for (i = j = 0; i < trail.size(); i++)
            if (seen[var(trail[i])] == 0)
                trail[j++] = trail[i];
        trail.shrink(i - j);
        //printf("trail.size()= %d, qhead = %d\n", trail.size(), qhead);
        qhead = trail.size();

        for (int i = 0; i < released_vars.size(); i++)
            seen[released_vars[i]] = 0;

        // Released variables are now ready to be reused:
        append(released_vars, free_vars);
        released_vars.clear();
    }
    checkGarbage();
    rebuildOrderHeap();

    simpDB_assigns = nAssigns();
    simpDB_props   = clauses_literals + learnts_literals;   // (shouldn't depend on stats really, but it will do for now)

    return true;
}